

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

uint32_t BrotliBuildSimpleHuffmanTable
                   (HuffmanCode *table,int root_bits,uint16_t *val,uint32_t num_symbols)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int local_3c;
  uint16_t t_1;
  int i_1;
  int iStack_30;
  uint16_t t;
  int k;
  int i;
  uint32_t goal_size;
  uint32_t table_size;
  uint32_t num_symbols_local;
  uint16_t *val_local;
  int root_bits_local;
  HuffmanCode *table_local;
  
  i = 1;
  val_local._4_1_ = (byte)root_bits;
  uVar2 = 1 << (val_local._4_1_ & 0x1f);
  switch(num_symbols) {
  case 0:
    table->bits = '\0';
    table->value = *val;
    break;
  case 1:
    table->bits = '\x01';
    table[1].bits = '\x01';
    if (*val < val[1]) {
      table->value = *val;
      table[1].value = val[1];
    }
    else {
      table->value = val[1];
      table[1].value = *val;
    }
    i = 2;
    break;
  case 2:
    table->bits = '\x01';
    table->value = *val;
    table[2].bits = '\x01';
    table[2].value = *val;
    if (val[1] < val[2]) {
      table[1].value = val[1];
      table[3].value = val[2];
    }
    else {
      table[1].value = val[2];
      table[3].value = val[1];
    }
    table[1].bits = '\x02';
    table[3].bits = '\x02';
    i = 4;
    break;
  case 3:
    for (iStack_30 = 0; i_1 = iStack_30, iStack_30 < 3; iStack_30 = iStack_30 + 1) {
      while (i_1 = i_1 + 1, i_1 < 4) {
        if (val[i_1] < val[iStack_30]) {
          uVar1 = val[i_1];
          val[i_1] = val[iStack_30];
          val[iStack_30] = uVar1;
        }
      }
    }
    for (iStack_30 = 0; iStack_30 < 4; iStack_30 = iStack_30 + 1) {
      table[iStack_30].bits = '\x02';
    }
    table->value = *val;
    table[2].value = val[1];
    table[1].value = val[2];
    table[3].value = val[3];
    i = 4;
    break;
  case 4:
    if (val[3] < val[2]) {
      uVar1 = val[3];
      val[3] = val[2];
      val[2] = uVar1;
    }
    for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
      table[local_3c].value = *val;
      table[local_3c].bits = ((byte)local_3c & 1) + 1;
    }
    table[1].value = val[1];
    table[3].value = val[2];
    table[5].value = val[1];
    table[7].value = val[3];
    table[3].bits = '\x03';
    table[7].bits = '\x03';
    i = 8;
  }
  for (; i != uVar2; i = i << 1) {
    memcpy(table + (uint)i,table,(ulong)(uint)i << 2);
  }
  return uVar2;
}

Assistant:

uint32_t BrotliBuildSimpleHuffmanTable(HuffmanCode* table,
                                       int root_bits,
                                       uint16_t* val,
                                       uint32_t num_symbols) {
  uint32_t table_size = 1;
  const uint32_t goal_size = 1U << root_bits;
  switch (num_symbols) {
    case 0:
      table[0].bits = 0;
      table[0].value = val[0];
      break;
    case 1:
      table[0].bits = 1;
      table[1].bits = 1;
      if (val[1] > val[0]) {
        table[0].value = val[0];
        table[1].value = val[1];
      } else {
        table[0].value = val[1];
        table[1].value = val[0];
      }
      table_size = 2;
      break;
    case 2:
      table[0].bits = 1;
      table[0].value = val[0];
      table[2].bits = 1;
      table[2].value = val[0];
      if (val[2] > val[1]) {
        table[1].value = val[1];
        table[3].value = val[2];
      } else {
        table[1].value = val[2];
        table[3].value = val[1];
      }
      table[1].bits = 2;
      table[3].bits = 2;
      table_size = 4;
      break;
    case 3: {
      int i, k;
      for (i = 0; i < 3; ++i) {
        for (k = i + 1; k < 4; ++k) {
          if (val[k] < val[i]) {
            uint16_t t = val[k];
            val[k] = val[i];
            val[i] = t;
          }
        }
      }
      for (i = 0; i < 4; ++i) {
        table[i].bits = 2;
      }
      table[0].value = val[0];
      table[2].value = val[1];
      table[1].value = val[2];
      table[3].value = val[3];
      table_size = 4;
      break;
    }
    case 4: {
      int i;
      if (val[3] < val[2]) {
        uint16_t t = val[3];
        val[3] = val[2];
        val[2] = t;
      }
      for (i = 0; i < 7; ++i) {
        table[i].value = val[0];
        table[i].bits = (uint8_t)(1 + (i & 1));
      }
      table[1].value = val[1];
      table[3].value = val[2];
      table[5].value = val[1];
      table[7].value = val[3];
      table[3].bits = 3;
      table[7].bits = 3;
      table_size = 8;
      break;
    }
  }
  while (table_size != goal_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }
  return goal_size;
}